

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lefreader.cpp
# Opt level: O3

bool __thiscall LEFReader::parseUnits(LEFReader *this)

{
  string *tokstr;
  char *__nptr;
  token_t tVar1;
  int iVar2;
  int *piVar3;
  undefined8 uVar4;
  double dVar5;
  string local_60;
  double local_38;
  
  tokstr = &this->m_tokstr;
  tVar1 = tokenize(this,tokstr);
  this->m_curtok = tVar1;
  if (tVar1 == TOK_EOL) {
    tVar1 = tokenize(this,tokstr);
    this->m_curtok = tVar1;
    while (tVar1 == TOK_IDENT) {
      iVar2 = std::__cxx11::string::compare((char *)tokstr);
      if (iVar2 == 0) {
        tVar1 = tokenize(this,tokstr);
        this->m_curtok = tVar1;
        if ((tVar1 != TOK_IDENT) ||
           (iVar2 = std::__cxx11::string::compare((char *)tokstr), iVar2 != 0)) {
          local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_60,"Expects MICRONS keywords after DATABASE\n","");
          error(this,&local_60);
          goto LAB_0012b844;
        }
        tVar1 = tokenize(this,tokstr);
        this->m_curtok = tVar1;
        if (tVar1 != TOK_NUMBER) {
          local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_60,"Expected a number after DATABASE MICRONS\n","");
          error(this,&local_60);
          goto LAB_0012b844;
        }
        __nptr = (tokstr->_M_dataplus)._M_p;
        piVar3 = __errno_location();
        iVar2 = *piVar3;
        *piVar3 = 0;
        dVar5 = strtod(__nptr,(char **)&local_60);
        if (local_60._M_dataplus._M_p == __nptr) {
          std::__throw_invalid_argument("stod");
LAB_0012b948:
          uVar4 = std::__throw_out_of_range("stod");
          if (local_60._M_dataplus._M_p != "END") {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
          _Unwind_Resume(uVar4);
        }
        local_38 = dVar5;
        if (*piVar3 == 0) {
          *piVar3 = iVar2;
        }
        else if (*piVar3 == 0x22) goto LAB_0012b948;
        tVar1 = tokenize(this,tokstr);
        this->m_curtok = tVar1;
        if (tVar1 != TOK_SEMICOL) {
          local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_60,"Expected ; after DATABASE MICRONS <number>\n","");
          error(this,&local_60);
          goto LAB_0012b844;
        }
        tVar1 = tokenize(this,tokstr);
        this->m_curtok = tVar1;
        if (tVar1 != TOK_EOL) {
          local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_60,"Expected EOL after DATABASE MICRONS <number> ;\n","");
          error(this,&local_60);
          goto LAB_0012b844;
        }
        (*this->_vptr_LEFReader[0x14])(local_38,this);
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)tokstr);
        if (iVar2 == 0) {
          tVar1 = tokenize(this,tokstr);
          this->m_curtok = tVar1;
          if (tVar1 == TOK_IDENT) {
            iVar2 = std::__cxx11::string::compare((char *)tokstr);
            if (iVar2 == 0) {
              return true;
            }
            tVar1 = this->m_curtok;
          }
          while ((tVar1 != TOK_EOF && (tVar1 != TOK_EOL))) {
            tVar1 = tokenize(this,tokstr);
            this->m_curtok = tVar1;
          }
        }
        else {
          tVar1 = this->m_curtok;
          while ((tVar1 != TOK_EOF && (tVar1 != TOK_EOL))) {
            tVar1 = tokenize(this,tokstr);
            this->m_curtok = tVar1;
          }
        }
      }
      tVar1 = tokenize(this,tokstr);
      this->m_curtok = tVar1;
    }
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"Expected string in units block\n","");
    error(this,&local_60);
  }
  else {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"Expected EOL after UNITS\n","");
    error(this,&local_60);
  }
LAB_0012b844:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool LEFReader::parseUnits()
{
    // UNITS
    //   DATABASE MICRONS ;
    //   ...
    // END UNITS

    // expect EOL after UNITS

    m_curtok = tokenize(m_tokstr);
    if (m_curtok != TOK_EOL)
    {
        error("Expected EOL after UNITS\n");
        return false;
    }

    while(1)
    {
        m_curtok = tokenize(m_tokstr);

        if (m_curtok != TOK_IDENT)
        {
            error("Expected string in units block\n");
            return false;
        }

        if (m_tokstr == "DATABASE")
        {
            m_curtok = tokenize(m_tokstr);
            if ((m_curtok == TOK_IDENT) && (m_tokstr == "MICRONS"))
            {
                m_curtok = tokenize(m_tokstr);
                if (m_curtok == TOK_NUMBER)
                {
                    double micronsd;
                    try
                    {
                        micronsd = std::stod(m_tokstr);
                    }
                    catch(const std::invalid_argument& ia)
                    {
                        error(ia.what());
                        return false;
                    }

                    // expect ; and EOL
                    m_curtok = tokenize(m_tokstr);
                    if (m_curtok != TOK_SEMICOL)
                    {
                        error("Expected ; after DATABASE MICRONS <number>\n");
                        return false;
                    }

                    m_curtok = tokenize(m_tokstr);
                    if (m_curtok != TOK_EOL)
                    {
                        error("Expected EOL after DATABASE MICRONS <number> ;\n");
                        return false;
                    }

                    onDatabaseUnitsMicrons(micronsd);
                }
                else
                {
                    error("Expected a number after DATABASE MICRONS\n");
                    return false;
                }
            }
            else
            {
                error("Expects MICRONS keywords after DATABASE\n");
                return false;
            }
        }
        else if (m_tokstr == "END")
        {
            // check for units
            m_curtok = tokenize(m_tokstr);
            if ((m_curtok == TOK_IDENT) && (m_tokstr == "UNITS"))
            {
                return true;
            }
            else
            {
                // read until EOL
                while ((m_curtok != TOK_EOL) && (m_curtok != TOK_EOF))
                {
                    m_curtok = tokenize(m_tokstr);
                }
            }
        }
        else
        {
            // got something other than DATABASE or END
            // read until EOL
            while ((m_curtok != TOK_EOL) && (m_curtok != TOK_EOF))
            {
                m_curtok = tokenize(m_tokstr);
            }
        }
    }
}